

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::ParseableFunctionInfo::GetExternalDisplayNameObject
          (ParseableFunctionInfo *this,ScriptContext *scriptContext)

{
  bool bVar1;
  char16 *srcName;
  JavascriptString *pJVar2;
  
  srcName = GetExternalDisplayName<Js::ParseableFunctionInfo>(this);
  if (((this->super_FunctionProxy).field_0x44 & 0x20) == 0) {
    bVar1 = FunctionProxy::IsConstantFunctionName(srcName);
    if (!bVar1) {
      pJVar2 = JavascriptString::NewCopySz(srcName,scriptContext);
      return pJVar2;
    }
  }
  pJVar2 = JavascriptString::NewWithSz(srcName,scriptContext);
  return pJVar2;
}

Assistant:

JavascriptString* ParseableFunctionInfo::GetExternalDisplayNameObject(ScriptContext* scriptContext) const
    {
        const char16* name = GetExternalDisplayName();

        if (!GetDisplayNameIsRecyclerAllocated() && !IsConstantFunctionName(name))
        {
            // The string is allocated in memory that we don't directly control the lifetime of. Copy the string to
            // ensure that the buffer remains valid for the lifetime of the object.
            return Js::JavascriptString::NewCopySz(name, scriptContext);
        }
        else
        {
            // Use the incoming buffer directly to create the object. This only works when the lifetime of the data is
            // static or GC allocated.
            return Js::JavascriptString::NewWithSz(name, scriptContext);
        }
    }